

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastEntityStatePdu.cpp
# Opt level: O1

void __thiscall DIS::FastEntityStatePdu::unmarshal(FastEntityStatePdu *this,DataStream *dataStream)

{
  uchar *c;
  pointer *ppAVar1;
  pointer pAVar2;
  pointer pAVar3;
  iterator __position;
  size_t idx;
  long lVar4;
  pointer pAVar5;
  byte bVar6;
  ArticulationParameter x;
  ArticulationParameter local_48;
  
  EntityInformationFamilyPdu::unmarshal(&this->super_EntityInformationFamilyPdu,dataStream);
  DataStream::operator>>
            (dataStream,
             (unsigned_short *)&(this->super_EntityInformationFamilyPdu).super_Pdu.field_0x14);
  DataStream::operator>>
            (dataStream,
             (unsigned_short *)&(this->super_EntityInformationFamilyPdu).super_Pdu.field_0x16);
  DataStream::operator>>(dataStream,&this->_entity);
  DataStream::operator>>(dataStream,&this->_forceId);
  c = &this->_numberOfArticulationParameters;
  DataStream::operator>>(dataStream,c);
  DataStream::operator>>(dataStream,&this->_entityKind);
  DataStream::operator>>(dataStream,&this->_domain);
  DataStream::operator>>(dataStream,&this->_country);
  DataStream::operator>>(dataStream,&this->_category);
  DataStream::operator>>(dataStream,&this->_subcategory);
  DataStream::operator>>(dataStream,&this->_specific);
  DataStream::operator>>(dataStream,&this->_extra);
  DataStream::operator>>(dataStream,&this->_altEntityKind);
  DataStream::operator>>(dataStream,&this->_altDomain);
  DataStream::operator>>(dataStream,&this->_altCountry);
  DataStream::operator>>(dataStream,&this->_altCategory);
  DataStream::operator>>(dataStream,&this->_altSubcategory);
  DataStream::operator>>(dataStream,&this->_altSpecific);
  DataStream::operator>>(dataStream,&this->_altExtra);
  DataStream::operator>>(dataStream,&this->_xVelocity);
  DataStream::operator>>(dataStream,&this->_yVelocity);
  DataStream::operator>>(dataStream,&this->_zVelocity);
  DataStream::operator>>(dataStream,&this->_xLocation);
  DataStream::operator>>(dataStream,&this->_yLocation);
  DataStream::operator>>(dataStream,&this->_zLocation);
  DataStream::operator>>(dataStream,&this->_psi);
  DataStream::operator>>(dataStream,&this->_theta);
  DataStream::operator>>(dataStream,&this->_phi);
  DataStream::operator>>(dataStream,&this->_entityAppearance);
  DataStream::operator>>(dataStream,&this->_deadReckoningAlgorithm);
  lVar4 = 0;
  do {
    DataStream::operator>>(dataStream,this->_otherParameters + lVar4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xf);
  DataStream::operator>>(dataStream,&this->_xAcceleration);
  DataStream::operator>>(dataStream,&this->_yAcceleration);
  DataStream::operator>>(dataStream,&this->_zAcceleration);
  DataStream::operator>>(dataStream,&this->_xAngularVelocity);
  DataStream::operator>>(dataStream,&this->_yAngularVelocity);
  DataStream::operator>>(dataStream,&this->_zAngularVelocity);
  lVar4 = 0;
  do {
    DataStream::operator>>(dataStream,this->_marking + lVar4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xc);
  DataStream::operator>>(dataStream,&this->_capabilities);
  pAVar2 = (this->_articulationParameters).
           super__Vector_base<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pAVar3 = (this->_articulationParameters).
           super__Vector_base<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pAVar5 = pAVar2;
  if (pAVar3 != pAVar2) {
    do {
      (**pAVar5->_vptr_ArticulationParameter)(pAVar5);
      pAVar5 = pAVar5 + 1;
    } while (pAVar5 != pAVar3);
    (this->_articulationParameters).
    super__Vector_base<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>.
    _M_impl.super__Vector_impl_data._M_finish = pAVar2;
  }
  if (*c != '\0') {
    bVar6 = 0;
    do {
      ArticulationParameter::ArticulationParameter(&local_48);
      ArticulationParameter::unmarshal(&local_48,dataStream);
      __position._M_current =
           (this->_articulationParameters).
           super__Vector_base<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->_articulationParameters).
          super__Vector_base<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<DIS::ArticulationParameter,std::allocator<DIS::ArticulationParameter>>::
        _M_realloc_insert<DIS::ArticulationParameter_const&>
                  ((vector<DIS::ArticulationParameter,std::allocator<DIS::ArticulationParameter>> *)
                   &this->_articulationParameters,__position,&local_48);
      }
      else {
        (__position._M_current)->_vptr_ArticulationParameter =
             (_func_int **)&PTR__ArticulationParameter_0019f588;
        (__position._M_current)->_parameterTypeDesignator = local_48._parameterTypeDesignator;
        (__position._M_current)->_changeIndicator = local_48._changeIndicator;
        (__position._M_current)->_partAttachedTo = local_48._partAttachedTo;
        (__position._M_current)->_parameterType = local_48._parameterType;
        (__position._M_current)->_parameterValue = local_48._parameterValue;
        ppAVar1 = &(this->_articulationParameters).
                   super__Vector_base<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppAVar1 = *ppAVar1 + 1;
      }
      ArticulationParameter::~ArticulationParameter(&local_48);
      bVar6 = bVar6 + 1;
    } while (bVar6 < *c);
  }
  return;
}

Assistant:

void FastEntityStatePdu::unmarshal(DataStream& dataStream)
{
    EntityInformationFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    dataStream >> _site;
    dataStream >> _application;
    dataStream >> _entity;
    dataStream >> _forceId;
    dataStream >> _numberOfArticulationParameters;
    dataStream >> _entityKind;
    dataStream >> _domain;
    dataStream >> _country;
    dataStream >> _category;
    dataStream >> _subcategory;
    dataStream >> _specific;
    dataStream >> _extra;
    dataStream >> _altEntityKind;
    dataStream >> _altDomain;
    dataStream >> _altCountry;
    dataStream >> _altCategory;
    dataStream >> _altSubcategory;
    dataStream >> _altSpecific;
    dataStream >> _altExtra;
    dataStream >> _xVelocity;
    dataStream >> _yVelocity;
    dataStream >> _zVelocity;
    dataStream >> _xLocation;
    dataStream >> _yLocation;
    dataStream >> _zLocation;
    dataStream >> _psi;
    dataStream >> _theta;
    dataStream >> _phi;
    dataStream >> _entityAppearance;
    dataStream >> _deadReckoningAlgorithm;

     for(size_t idx = 0; idx < 15; idx++)
     {
        dataStream >> _otherParameters[idx];
     }

    dataStream >> _xAcceleration;
    dataStream >> _yAcceleration;
    dataStream >> _zAcceleration;
    dataStream >> _xAngularVelocity;
    dataStream >> _yAngularVelocity;
    dataStream >> _zAngularVelocity;

     for(size_t idx = 0; idx < 12; idx++)
     {
        dataStream >> _marking[idx];
     }

    dataStream >> _capabilities;

     _articulationParameters.clear();
     for(unsigned char idx = 0; idx < _numberOfArticulationParameters; idx++)
     {
        ArticulationParameter x;
        x.unmarshal(dataStream);
        _articulationParameters.push_back(x);
     }
}